

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_enum_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  llmsset_t plVar2;
  int iVar3;
  MTBDD MVar4;
  uint8_t *puVar5;
  long lVar6;
  
  plVar2 = nodes;
  do {
    iVar3 = mtbdd_isleaf(dd);
    if (iVar3 != 0) {
      return 0;
    }
    while( true ) {
      puVar5 = arr;
      arr = puVar5 + 1;
      if (variables == 0x8000000000000000) {
        return 0;
      }
      variables = mtbdd_gethigh(variables);
      if (*puVar5 == '\x01') break;
      if (*puVar5 == '\0') {
        puVar1 = plVar2->data;
        lVar6 = (dd & 0xffffffffff) * 0x10;
        MVar4 = mtbdd_enum_next(*(ulong *)(puVar1 + lVar6 + 8) & 0xffffffffff |
                                dd & 0x8000000000000000,variables,arr,filter_cb);
        if (MVar4 != 0) {
          return MVar4;
        }
        MVar4 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff ^
                                 dd & 0x8000000000000000,variables,arr,filter_cb);
        if (MVar4 != 0) {
          *puVar5 = '\x01';
          return MVar4;
        }
        return 0;
      }
    }
    dd = dd & 0x8000000000000000 ^
         *(ulong *)(plVar2->data + (dd & 0xffffffffff) * 0x10) & 0x800000ffffffffff;
  } while( true );
}

Assistant:

MTBDD
mtbdd_enum_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (mtbdd_isleaf(dd)) {
        // we find the leaf in 'enum_next', then we've seen it before...
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        return mtbdd_false;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        variables = mtbdd_gethigh(variables);

        if (*arr == 0) {
            // previous was low
            mtbddnode_t n = MTBDD_GETNODE(dd);
            MTBDD res = mtbdd_enum_next(node_getlow(dd, n), variables, arr+1, filter_cb);
            if (res != mtbdd_false) {
                return res;
            } else {
                // try to find new in high branch
                res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
                if (res != mtbdd_false) {
                    *arr = 1;
                    return res;
                } else {
                    return mtbdd_false;
                }
            }
        } else if (*arr == 1) {
            // previous was high
            mtbddnode_t n = MTBDD_GETNODE(dd);
            return mtbdd_enum_next(node_gethigh(dd, n), variables, arr+1, filter_cb);
        } else {
            // previous was either
            return mtbdd_enum_next(dd, variables, arr+1, filter_cb);
        }
    }
}